

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O2

int __thiscall SocketClient::connect(SocketClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int *piVar2;
  uint7 uVar3;
  undefined4 in_register_00000034;
  shared_ptr<SocketClient> *args;
  SharedPtr loop;
  SharedPtr unixSocket;
  sockaddr local_96 [6];
  
  iVar1 = init(this,(EVP_PKEY_CTX *)0x4);
  if ((char)iVar1 == '\0') {
    iVar1 = 0;
  }
  else {
    local_96[0].sa_family = 1;
    strncpy(local_96[0].sa_data,*(char **)CONCAT44(in_register_00000034,__fd),0x6c);
    std::__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SocketClient,void>
              ((__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2> *)&unixSocket,
               (__weak_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2> *)this);
    do {
      iVar1 = ::connect(this->mFd,local_96,0x6e);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    std::__cxx11::string::_M_assign((string *)&this->mAddress);
    uVar3 = (uint7)(uint3)((uint)iVar1 >> 8);
    if (iVar1 == 0) {
      this->mSocketState = Connected;
      iVar1 = (int)CONCAT71(uVar3,1);
      Signal<std::function<void(std::shared_ptr<SocketClient>const&)>>::operator()
                ((Signal<std::function<void(std::shared_ptr<SocketClient>const&)>> *)
                 &this->signalConnected,&unixSocket);
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 == 0x73) {
        EventLoop::eventLoop();
        if ((EventLoop *)
            CONCAT44(loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                     loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_) !=
            (EventLoop *)0x0) {
          EventLoop::updateSocket
                    ((EventLoop *)
                     CONCAT44(loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                              _4_4_,loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr._0_4_),this->mFd,7);
          this->mWriteWait = true;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        this->mSocketState = Connecting;
        iVar1 = (int)CONCAT71(uVar3,1);
      }
      else {
        loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 2;
        args = &unixSocket;
        Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
        operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                    *)&this->mSignalError,args,(Error *)&loop);
        close(this,(int)args);
        iVar1 = 0;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&unixSocket.super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  return iVar1;
}

Assistant:

bool SocketClient::connect(const String& path)
{
    if (!init(Unix))
        return false;

    union {
        sockaddr_un addr_un;
        sockaddr addr;
    };
    memset(&addr_un, '\0', sizeof(addr_un));
    addr_un.sun_family = AF_UNIX;
    strncpy(addr_un.sun_path, path.constData(), sizeof(addr_un.sun_path));

    SocketClient::SharedPtr unixSocket = shared_from_this();

    int e;
    eintrwrap(e, ::connect(mFd, &addr, sizeof(addr_un)));
    mAddress = path;
    if (e == 0) { // we're done
        mSocketState = Connected;

        signalConnected(unixSocket);
    } else {
        if (errno != EINPROGRESS) {
            // bad
            mSignalError(unixSocket, ConnectError);
            close();
            return false;
        }
        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
            loop->updateSocket(mFd, EventLoop::SocketRead|EventLoop::SocketWrite|EventLoop::SocketOneShot);
            mWriteWait = true;
        }
        mSocketState = Connecting;
    }
    return true;
}